

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_158f94a::ResolvePath(anon_unknown_dwarf_158f94a *this,Value *json,Args path)

{
  ptrdiff_t *ppVar1;
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  bool bVar2;
  ArrayIndex max;
  int index;
  ValueType type;
  json_error *pjVar3;
  Value *key;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  string_view separator;
  string_view separator_00;
  Args progress;
  string progressStr;
  Args local_108;
  Value *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  Value *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 local_b8 [16];
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  ValueHolder local_80;
  undefined8 local_78;
  char *local_70;
  string_view local_68;
  string local_50;
  
  if (json != (Value *)path.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .Begin._M_current._M_current) {
    key = json;
    do {
      ppVar1 = &key->limit_;
      local_108.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)json;
      local_108.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar1;
      bVar2 = Json::Value::isArray((Value *)this);
      if (bVar2) {
        local_b8._0_8_ =
             local_108.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        local_b8._8_8_ =
             local_108.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        local_a8 = CONCAT71(local_a8._1_7_,true);
        max = Json::Value::size((Value *)this);
        index = ParseIndex((string *)key,(optional<(anonymous_namespace)::Args> *)local_b8,max);
        this = (anon_unknown_dwarf_158f94a *)Json::Value::operator[]((Value *)this,index);
      }
      else {
        bVar2 = Json::Value::isObject((Value *)this);
        if (!bVar2) {
          separator_00._M_str = " ";
          separator_00._M_len = 1;
          cmJoin<(anonymous_namespace)::Args>(&local_50,&local_108,separator_00);
          pjVar3 = (json_error *)__cxa_allocate_exception(0x28);
          local_b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
          local_b8._8_8_ = "invalid path \'";
          local_a8 = local_50._M_string_length;
          local_a0 = local_50._M_dataplus._M_p;
          local_98 = 0x33;
          local_90 = "\', need element of OBJECT or ARRAY type to lookup \'";
          local_80 = key->value_;
          local_88 = *(undefined8 *)&key->bits_;
          local_78 = 6;
          local_70 = "\' got ";
          type = Json::Value::type((Value *)this);
          local_68 = JsonTypeToString(type);
          local_f8 = (Value *)local_108.
                              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .Begin._M_current;
          pbStack_f0 = local_108.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
          local_e8 = 1;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_e7;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_108.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
          errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_108.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
          message_00._M_len = 6;
          message_00._M_array = (iterator)local_b8;
          json_error::json_error(pjVar3,message_00,errorPath_00);
          __cxa_throw(pjVar3,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        bVar2 = Json::Value::isMember((Value *)this,(String *)key);
        if (!bVar2) {
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<(anonymous_namespace)::Args>(&local_50,&local_108,separator);
          pjVar3 = (json_error *)__cxa_allocate_exception(0x28);
          local_b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
          local_b8._8_8_ = "member \'";
          local_a8 = local_50._M_string_length;
          local_a0 = local_50._M_dataplus._M_p;
          local_98 = 0xb;
          local_90 = "\' not found";
          local_d8 = (Value *)local_108.
                              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .Begin._M_current;
          pbStack_d0 = local_108.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
          local_c8 = 1;
          errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_c7;
          errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_108.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
          errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_108.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
          message._M_len = 3;
          message._M_array = (iterator)local_b8;
          json_error::json_error(pjVar3,message,errorPath);
          __cxa_throw(pjVar3,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        this = (anon_unknown_dwarf_158f94a *)Json::Value::operator[]((Value *)this,(String *)key);
      }
      key = (Value *)ppVar1;
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar1 !=
             path.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current._M_current);
  }
  return (Value *)this;
}

Assistant:

Json::Value& ResolvePath(Json::Value& json, Args path)
{
  Json::Value* search = &json;

  for (auto curr = path.begin(); curr != path.end(); ++curr) {
    const std::string& field = *curr;
    Args progress{ path.begin(), curr + 1 };

    if (search->isArray()) {
      auto index = ParseIndex(field, progress, search->size());
      search = &(*search)[index];

    } else if (search->isObject()) {
      if (!search->isMember(field)) {
        const auto progressStr = cmJoin(progress, " "_s);
        throw json_error({ "member '"_s, progressStr, "' not found"_s },
                         progress);
      }
      search = &(*search)[field];
    } else {
      const auto progressStr = cmJoin(progress, " "_s);
      throw json_error(
        { "invalid path '"_s, progressStr,
          "', need element of OBJECT or ARRAY type to lookup '"_s, field,
          "' got "_s, JsonTypeToString(search->type()) },
        progress);
    }
  }
  return *search;
}